

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.cpp
# Opt level: O2

int Timidity::update_vibrato(float output_rate,Voice *vp,int sign)

{
  float fVar1;
  float fVar2;
  Sample *pSVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  
  uVar5 = 0;
  if (vp->vibrato_phase < 0x3f) {
    uVar5 = vp->vibrato_phase + 1;
  }
  vp->vibrato_phase = uVar5;
  if ((int)uVar5 < 0x10) {
    iVar6 = 0xf;
  }
  else {
    if (uVar5 < 0x30) {
      iVar6 = uVar5 - 0x10;
      goto LAB_00371e25;
    }
    iVar6 = 0x4f;
  }
  iVar6 = iVar6 - uVar5;
LAB_00371e25:
  iVar8 = vp->vibrato_sample_increment[iVar6];
  if (iVar8 == 0) {
    pSVar3 = vp->sample;
    iVar8 = (uint)pSVar3->vibrato_depth * 0x80;
    bVar4 = true;
    if (vp->vibrato_sweep != 0) {
      iVar7 = vp->vibrato_sweep + vp->vibrato_sweep_position;
      vp->vibrato_sweep_position = iVar7;
      if (iVar7 < 0x10000) {
        iVar8 = iVar7 * iVar8 >> 0x10;
        bVar4 = false;
      }
      else {
        vp->vibrato_sweep = 0;
      }
    }
    iVar7 = pSVar3->sample_rate;
    fVar1 = vp->frequency;
    fVar2 = pSVar3->root_freq;
    dVar9 = sin((double)(int)uVar5 * 9.587379924285257e-05);
    dVar9 = exp2(dVar9 * 1.0172526041666666e-05 * (double)iVar8);
    dVar9 = ((double)iVar7 * 4096.0 * (double)fVar1 * dVar9) / ((double)output_rate * (double)fVar2)
    ;
    if (bVar4) {
      vp->vibrato_sample_increment[iVar6] = (int)dVar9;
    }
    if (sign != 0) {
      dVar9 = -dVar9;
    }
    iVar6 = (int)dVar9;
  }
  else {
    iVar6 = -iVar8;
    if (sign == 0) {
      iVar6 = iVar8;
    }
  }
  return iVar6;
}

Assistant:

static int update_vibrato(float output_rate, Voice *vp, int sign)
{
	int depth;
	int phase;
	double a, pb;

	if (vp->vibrato_phase++ >= 2 * VIBRATO_SAMPLE_INCREMENTS - 1)
		vp->vibrato_phase = 0;
	phase = vib_phase_to_inc_ptr(vp->vibrato_phase);

	if (vp->vibrato_sample_increment[phase])
	{
		if (sign)
			return -vp->vibrato_sample_increment[phase];
		else
			return vp->vibrato_sample_increment[phase];
	}

	/* Need to compute this sample increment. */
	depth = vp->sample->vibrato_depth << 7;

	if (vp->vibrato_sweep != 0)
	{
		/* Need to update sweep */
		vp->vibrato_sweep_position += vp->vibrato_sweep;
		if (vp->vibrato_sweep_position >= (1<<SWEEP_SHIFT))
			vp->vibrato_sweep=0;
		else
		{
			/* Adjust depth */
			depth *= vp->vibrato_sweep_position;
			depth >>= SWEEP_SHIFT;
		}
	}

	a = FSCALE(((double)(vp->sample->sample_rate) * vp->frequency) /
		((double)(vp->sample->root_freq) * output_rate),
		FRACTION_BITS);

	pb = (sine(vp->vibrato_phase * (1.0/(2*VIBRATO_SAMPLE_INCREMENTS)))
		* (double)(depth) * VIBRATO_AMPLITUDE_TUNING);

	a *= pow(2.0, pb / (8192 * 12.f));

	/* If the sweep's over, we can store the newly computed sample_increment */
	if (!vp->vibrato_sweep)
		vp->vibrato_sample_increment[phase] = (int) a;

	if (sign)
		a = -a; /* need to preserve the loop direction */

	return (int) a;
}